

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<int_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,optional<int> *rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  lest *this_00;
  optional<int> *in_R8;
  allocator<char> local_71;
  string local_70 [32];
  string local_50;
  
  this_00 = *(lest **)this;
  bVar1 = (rhs->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int>.
          _M_engaged;
  iVar2 = *(int *)this_00;
  iVar3 = (rhs->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int>.
          _M_payload._M_value;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"==",&local_71);
  to_string<int,std::optional<int>>(&local_50,this_00,(int *)local_70,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = (bool)(bVar1 & iVar2 == iVar3);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_50)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_70);
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }